

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O2

int * Ivy_TableFind(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  int TableSize;
  int iVar1;
  uint uVar2;
  
  if (0xfffffffc < (*(uint *)&pObj->field_0x8 & 0xf) - 7) {
    TableSize = p->nTableSize;
    uVar2 = Ivy_Hash(pObj,TableSize);
    while( true ) {
      iVar1 = p->pTable[(int)uVar2];
      if ((iVar1 == 0) || (iVar1 == pObj->Id)) break;
      uVar2 = (int)(uVar2 + 1) % TableSize;
    }
    return p->pTable + (int)uVar2;
  }
  __assert_fail("Ivy_ObjIsHash(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyTable.c"
                ,0x2e,"int *Ivy_TableFind(Ivy_Man_t *, Ivy_Obj_t *)");
}

Assistant:

static int * Ivy_TableFind( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    int i;
    assert( Ivy_ObjIsHash(pObj) );
    for ( i = Ivy_Hash(pObj, p->nTableSize); p->pTable[i]; i = (i+1) % p->nTableSize )
        if ( p->pTable[i] == pObj->Id )
            break;
    return p->pTable + i;
}